

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

void * rw::copyHAnim(void *dst,void *src,int32 offset,int32 param_4)

{
  int iVar1;
  uint *puVar2;
  HAnimNodeInfo *pHVar3;
  long lVar4;
  HAnimHierarchy *pHVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar8 = (long)offset;
  *(undefined4 *)((long)dst + lVar8) = *(undefined4 *)((long)src + lVar8);
  *(undefined8 *)((long)dst + lVar8 + 8) = 0;
  puVar2 = *(uint **)((long)src + lVar8 + 8);
  if ((puVar2 != (uint *)0x0) && ((*puVar2 & 1) == 0)) {
    pHVar5 = HAnimHierarchy::create
                       (puVar2[1],(int32 *)0x0,(int32 *)0x0,*puVar2,
                        *(int32 *)(*(long *)(puVar2 + 0xc) + 0x18));
    iVar1 = pHVar5->numNodes;
    lVar6 = 8;
    for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
      pHVar3 = pHVar5->nodeInfo;
      *(undefined8 *)((long)&pHVar3->flags + lVar6) = 0;
      lVar4 = *(long *)(puVar2 + 6);
      *(undefined4 *)((long)&pHVar3->id + lVar6) = *(undefined4 *)(lVar4 + lVar6);
      *(undefined8 *)((long)pHVar3 + lVar6 + -8) = *(undefined8 *)(lVar4 + -8 + lVar6);
      lVar6 = lVar6 + 0x18;
    }
    *(HAnimHierarchy **)((long)dst + lVar8 + 8) = pHVar5;
    pHVar5->parentFrame = (Frame *)dst;
  }
  return dst;
}

Assistant:

static void*
copyHAnim(void *dst, void *src, int32 offset, int32)
{
	int i;
	HAnimData *dsthanim = PLUGINOFFSET(HAnimData, dst, offset);
	HAnimData *srchanim = PLUGINOFFSET(HAnimData, src, offset);
	HAnimHierarchy *srchier, *dsthier;
	dsthanim->id = srchanim->id;
	dsthanim->hierarchy = nil;
	srchier = srchanim->hierarchy;
	if(srchier && !(srchier->flags & HAnimHierarchy::SUBHIERARCHY)){
		dsthier = HAnimHierarchy::create(srchier->numNodes, nil, nil, srchier->flags, srchier->interpolator->maxInterpKeyFrameSize);
		for(i = 0; i < dsthier->numNodes; i++){
			dsthier->nodeInfo[i].frame = nil;
			dsthier->nodeInfo[i].flags = srchier->nodeInfo[i].flags;
			dsthier->nodeInfo[i].index = srchier->nodeInfo[i].index;
			dsthier->nodeInfo[i].id = srchier->nodeInfo[i].id;
		}
		dsthanim->hierarchy = dsthier;
		dsthier->parentFrame = (Frame*)dst;
	}
	return dst;
}